

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStream.hpp
# Opt level: O3

void __thiscall Qentem::StringStream<char>::allocate(StringStream<char> *this,SizeT size)

{
  int *piVar1;
  uint uVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar2 = (uint)(byte)((byte)LZCOUNT(size) ^ 0x1f);
  uVar6 = 1 << (uVar2 & 0x1f);
  uVar2 = 2 << (uVar2 & 0x1f);
  if (size <= uVar6) {
    uVar2 = uVar6;
  }
  pcVar3 = (char *)operator_new((ulong)uVar2);
  if (MemoryRecord::AddAllocation(void*)::storage == '\0') {
    allocate();
  }
  piVar1 = MemoryRecord::AddAllocation(void*)::storage;
  *MemoryRecord::AddAllocation(void*)::storage = *MemoryRecord::AddAllocation(void*)::storage + 1;
  piVar1[2] = piVar1[2] + 1;
  lVar4 = malloc_usable_size(pcVar3);
  piVar1 = MemoryRecord::AddAllocation(void*)::storage;
  uVar5 = lVar4 + *(long *)(MemoryRecord::AddAllocation(void*)::storage + 4);
  *(ulong *)(MemoryRecord::AddAllocation(void*)::storage + 4) = uVar5;
  if (*(ulong *)(piVar1 + 6) < uVar5) {
    *(ulong *)(piVar1 + 6) = uVar5;
  }
  this->storage_ = pcVar3;
  this->capacity_ = uVar2;
  return;
}

Assistant:

void allocate(SizeT size) {
        size = Memory::AlignSize(size);

        setStorage(Memory::Allocate<Char_T>(size));

        setCapacity(size);
    }